

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
          (DListBase<Memory::CustomHeap::Page,_RealCount> *this,Page *element,
          DListBase<Memory::CustomHeap::Page,_RealCount> *list)

{
  code *pcVar1;
  bool bVar2;
  char **node_00;
  undefined4 *puVar3;
  DListNodeBase<Memory::CustomHeap::Page> **ppDVar4;
  Node *node;
  DListBase<Memory::CustomHeap::Page,_RealCount> *list_local;
  Page *element_local;
  DListBase<Memory::CustomHeap::Page,_RealCount> *this_local;
  
  node_00 = &element[-1].address;
  bVar2 = HasNode(this,(NodeBase *)node_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x1a9,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  RemoveNode((NodeBase *)node_00);
  ppDVar4 = DListNodeBase<Memory::CustomHeap::Page>::Next
                      (&list->super_DListNodeBase<Memory::CustomHeap::Page>);
  InsertNodeBefore(*ppDVar4,(NodeBase *)node_00);
  RealCount::DecrementCount(&this->super_RealCount);
  RealCount::IncrementCount(&list->super_RealCount);
  return;
}

Assistant:

void MoveElementTo(TData * element, DListBase * list)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        DListBase::InsertNodeBefore(list->Next(), node);
        this->DecrementCount();
        list->IncrementCount();
    }